

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O2

void __thiscall Neuron_testTeachNegative_Test::TestBody(Neuron_testTeachNegative_Test *this)

{
  bool bVar1;
  Connections *pCVar2;
  ostream *poVar3;
  char *message;
  char *in_R9;
  int iVar4;
  int iVar5;
  float fVar6;
  AssertHelper local_360;
  AssertionResult gtest_ar_;
  float local_348;
  int spiked;
  AssertionResult gtest_ar;
  AssertHelper local_320;
  float local_314;
  Neuron n1;
  Neuron n2;
  ofstream fn;
  
  Neuron::Neuron(&n1,10.0,1.0,50.0);
  Neuron::Neuron(&n2,30.0,1.0,50.0);
  Neuron::connectTo(&n1,&n2,-50.0);
  pCVar2 = Neuron::connections(&n1);
  local_348 = Connection::weight((pCVar2->
                                 super__Vector_base<Connection,_std::allocator<Connection>_>).
                                 _M_impl.super__Vector_impl_data._M_start);
  std::ofstream::ofstream(&fn);
  std::ofstream::open((char *)&fn,0x13e423);
  Neuron::spike(&n1);
  iVar5 = 0;
  Neuron::apply(&n2,50.0,(Connection *)0x0);
  spiked = 0;
  iVar4 = 0;
  do {
    if (iVar4 == 600) {
      gtest_ar_.success_ = true;
      gtest_ar_._1_3_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"2","spiked",(int *)&gtest_ar_,&spiked);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_360,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0xc2,message);
        testing::internal::AssertHelper::operator=(&local_360,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_360);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::ofstream::~ofstream(&fn);
      Neuron::~Neuron(&n2);
      Neuron::~Neuron(&n1);
      return;
    }
    local_314 = Neuron::mem(&n2);
    poVar3 = (ostream *)std::ostream::operator<<(&fn,iVar4);
    poVar3 = std::operator<<(poVar3,"; ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_314);
    poVar3 = std::operator<<(poVar3,"; ");
    std::endl<char,std::char_traits<char>>(poVar3);
    Neuron::tick(&n1,1.0);
    bVar1 = Neuron::tick(&n2,1.0);
    if (bVar1) {
      pCVar2 = Neuron::connections(&n1);
      fVar6 = Connection::weight((pCVar2->
                                 super__Vector_base<Connection,_std::allocator<Connection>_>).
                                 _M_impl.super__Vector_impl_data._M_start);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = fVar6 < local_348;
      if (local_348 <= fVar6) {
        testing::Message::Message((Message *)&local_360);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"n1.connections()[0].weight() < w","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_320,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                   ,0xb0,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_360);
        testing::internal::AssertHelper::~AssertHelper(&local_320);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_360);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      pCVar2 = Neuron::connections(&n1);
      local_348 = Connection::weight((pCVar2->
                                     super__Vector_base<Connection,_std::allocator<Connection>_>).
                                     _M_impl.super__Vector_impl_data._M_start);
      iVar5 = iVar5 + 1;
      spiked = iVar5;
    }
    if ((iVar4 == 0x14a) || (iVar4 == 200)) {
      Neuron::spike(&n1);
    }
    else {
      if (iVar4 == 0x140) {
        bVar1 = Neuron::apply(&n2,50.0,(Connection *)0x0);
        gtest_ar_.success_ = bVar1;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar1) {
          testing::Message::Message((Message *)&local_360);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"n2.apply(50)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0xbc,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_360);
LAB_00124bb7:
          testing::internal::AssertHelper::~AssertHelper(&local_320);
          std::__cxx11::string::~string((string *)&gtest_ar);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_360);
        }
      }
      else {
        if (iVar4 != 0xb4) goto LAB_00124bdb;
        bVar1 = Neuron::apply(&n2,50.0,(Connection *)0x0);
        gtest_ar_.success_ = bVar1;
        gtest_ar_.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!bVar1) {
          testing::Message::Message((Message *)&local_360);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"n2.apply(50)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_320,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
                     ,0xb6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_360);
          goto LAB_00124bb7;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
LAB_00124bdb:
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

TEST(Neuron, testTeachNegative)
{
    Neuron n1;
    Neuron n2(30);
    n1.connectTo(&n2, -50.0f);
    float w = n1.connections()[0].weight();
    std::ofstream fn;
    fn.open("testTeachNegative.csv");

    n1.spike();
    n2.apply(50);
    int spiked = 0;
    for (int t = 0; t < 600; ++t) {
        float mem = n2.mem();
        fn << t << "; " << mem << "; " << std::endl;
        n1.tick(TIME_STEP);
        if (n2.tick(TIME_STEP)) {
            EXPECT_TRUE(n1.connections()[0].weight() < w);
            w = n1.connections()[0].weight();
            ++spiked;
        }

        if (t == 180)
            EXPECT_TRUE(n2.apply(50));

        if (t == 200)
            n1.spike();

        if (t == 320)
            EXPECT_TRUE(n2.apply(50));

        if (t == 330)
            n1.spike();

    }
    EXPECT_EQ(2, spiked);
}